

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::hugeint_t,unsigned_int,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::ExtractVersionUuidOperator>>
               (hugeint_t *ldata,uint *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  char *pcVar5;
  char *pcVar6;
  idx_t iVar7;
  unsigned_long uVar8;
  int64_t *piVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  char uuid [36];
  element_type *local_68;
  undefined8 uStack_60;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      piVar9 = &ldata->upper;
      iVar7 = 0;
      do {
        input.upper = (int64_t)&local_68;
        input.lower = *piVar9;
        BaseUUID::ToString((BaseUUID *)((hugeint_t *)(piVar9 + -1))->lower,input,(char *)mask);
        result_data[iVar7] = (int)uStack_60._6_1_ - 0x30;
        iVar7 = iVar7 + 1;
        piVar9 = piVar9 + 2;
      } while (count != iVar7);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_68,(unsigned_long **)mask,&local_38);
      p_Var3 = uStack_60;
      peVar2 = local_68;
      local_68 = (element_type *)0x0;
      uStack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (uStack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_60);
      }
      pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar4->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      pcVar6 = (char *)0x0;
      uVar12 = 0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar8 = 0xffffffffffffffff;
        }
        else {
          uVar8 = puVar1[(long)pcVar6];
        }
        uVar11 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar11 = count;
        }
        uVar10 = uVar11;
        if (uVar8 != 0) {
          uVar10 = uVar12;
          if (uVar8 == 0xffffffffffffffff) {
            if (uVar12 < uVar11) {
              piVar9 = &ldata[uVar12].upper;
              pcVar5 = pcVar6;
              do {
                input_00.upper = (int64_t)&local_68;
                input_00.lower = *piVar9;
                BaseUUID::ToString((BaseUUID *)((hugeint_t *)(piVar9 + -1))->lower,input_00,pcVar5);
                result_data[uVar12] = (int)uStack_60._6_1_ - 0x30;
                uVar12 = uVar12 + 1;
                piVar9 = piVar9 + 2;
                uVar10 = uVar12;
              } while (uVar11 != uVar12);
            }
          }
          else if (uVar12 < uVar11) {
            piVar9 = &ldata[uVar12].upper;
            uVar10 = 0;
            pcVar5 = pcVar6;
            do {
              if ((uVar8 >> (uVar10 & 0x3f) & 1) != 0) {
                input_01.upper = (int64_t)&local_68;
                input_01.lower = *piVar9;
                BaseUUID::ToString((BaseUUID *)((hugeint_t *)(piVar9 + -1))->lower,input_01,pcVar5);
                result_data[uVar12 + uVar10] = (int)uStack_60._6_1_ - 0x30;
              }
              uVar10 = uVar10 + 1;
              piVar9 = piVar9 + 2;
            } while ((uVar12 - uVar11) + uVar10 != 0);
            uVar10 = uVar12 + uVar10;
          }
        }
        pcVar6 = pcVar6 + 1;
        uVar12 = uVar10;
      } while (pcVar6 != (char *)(count + 0x3f >> 6));
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}